

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O0

bool __thiscall crnlib::dxt_image::flip_x(dxt_image *this)

{
  undefined4 uVar1;
  uint block_x;
  uint w_00;
  uint uVar2;
  element_type eVar3;
  dxt1_block *pdVar4;
  dxt1_block local_38;
  element tmp;
  uint local_28;
  uint e;
  uint y;
  uint w;
  uint x;
  uint mid_x;
  dxt_image *this_local;
  
  if ((((this->m_format == cETC1) || (this->m_format == cETC2)) || (this->m_format == cETC2A)) ||
     ((this->m_format == cETC1S || (this->m_format == cETC2AS)))) {
    this_local._7_1_ = false;
  }
  else if (((this->m_width & 3) == 0) || (this->m_width < 5)) {
    if (this->m_width == 1) {
      this_local._7_1_ = true;
    }
    else {
      block_x = this->m_blocks_x >> 1;
      for (y = 0; y < block_x; y = y + 1) {
        flip_col(this,y);
      }
      if ((this->m_blocks_x & 1) != 0) {
        w_00 = math::minimum<unsigned_int>(this->m_width,4);
        for (local_28 = 0; local_28 < this->m_blocks_y; local_28 = local_28 + 1) {
          tmp.m_bytes[4] = '\0';
          tmp.m_bytes[5] = '\0';
          tmp.m_bytes[6] = '\0';
          tmp.m_bytes[7] = '\0';
          for (; uVar1 = tmp.m_bytes._4_4_, uVar2 = get_elements_per_block(this),
              (uint)uVar1 < uVar2; tmp.m_bytes._4_4_ = tmp.m_bytes._4_4_ + 1) {
            pdVar4 = (dxt1_block *)get_element(this,block_x,local_28,tmp.m_bytes._4_4_);
            local_38 = *pdVar4;
            eVar3 = get_element_type(this,tmp.m_bytes._4_4_);
            if (eVar3 == cColorDXT1) {
              dxt1_block::flip_x(&local_38,w_00,4);
            }
            else if (eVar3 == cAlphaDXT3) {
              dxt3_block::flip_x((dxt3_block *)&local_38,w_00,4);
            }
            else if (eVar3 == cAlphaDXT5) {
              dxt5_block::flip_x((dxt5_block *)&local_38,w_00,4);
            }
            pdVar4 = (dxt1_block *)get_element(this,block_x,local_28,tmp.m_bytes._4_4_);
            *pdVar4 = local_38;
          }
        }
      }
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool dxt_image::flip_x()
    {
        if (m_format == cETC1 || m_format == cETC2 || m_format == cETC2A || m_format == cETC1S || m_format == cETC2AS)
        {
            // Can't reliably flip ETCn textures (because of asymmetry in the 555/333 differential coding of subblock colors).
            return false;
        }

        if ((m_width & 3) && (m_width > 4))
        {
            return false;
        }

        if (m_width == 1)
        {
            return true;
        }

        const uint mid_x = m_blocks_x / 2;

        for (uint x = 0; x < mid_x; x++)
        {
            flip_col(x);
        }

        if (m_blocks_x & 1)
        {
            const uint w = math::minimum(m_width, 4U);
            for (uint y = 0; y < m_blocks_y; y++)
            {
                for (uint e = 0; e < get_elements_per_block(); e++)
                {
                    element tmp(get_element(mid_x, y, e));
                    switch (get_element_type(e))
                    {
                    case cColorDXT1:
                        reinterpret_cast<dxt1_block*>(&tmp)->flip_x(w, 4);
                        break;
                    case cAlphaDXT3:
                        reinterpret_cast<dxt3_block*>(&tmp)->flip_x(w, 4);
                        break;
                    case cAlphaDXT5:
                        reinterpret_cast<dxt5_block*>(&tmp)->flip_x(w, 4);
                        break;
                    default:
                        CRNLIB_ASSERT(0);
                        break;
                    }
                    get_element(mid_x, y, e) = tmp;
                }
            }
        }

        return true;
    }